

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::MultipartFormDataParser::MultipartFormDataParser(MultipartFormDataParser *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  MultipartFormDataParser *local_10;
  MultipartFormDataParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"--",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->crlf_,"\r\n",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->dash_crlf_,"--\r\n",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::__cxx11::string::string((string *)&this->boundary_);
  std::__cxx11::string::string((string *)&this->dash_boundary_crlf_);
  std::__cxx11::string::string((string *)&this->crlf_dash_boundary_);
  this->state_ = 0;
  this->is_valid_ = false;
  MultipartFormData::MultipartFormData(&this->file_);
  std::__cxx11::string::string((string *)&this->buf_);
  this->buf_spos_ = 0;
  this->buf_epos_ = 0;
  return;
}

Assistant:

MultipartFormDataParser() = default;